

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

int Potassco::xconvert(char *x,bool *out,char **errPos,int param_4)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  long lStack_30;
  
  if (x == (char *)0x0) {
LAB_001178bb:
    iVar2 = 0;
    goto LAB_0011793c;
  }
  cVar1 = *x;
  bVar3 = true;
  if (cVar1 == 'y') {
    if ((x[1] != 'e') || (x[2] != 's')) goto LAB_001178fd;
    lStack_30 = 3;
LAB_00117933:
    *out = bVar3;
    x = x + lStack_30;
  }
  else {
    lStack_30 = 1;
    if (cVar1 == '0') {
LAB_00117931:
      bVar3 = false;
      goto LAB_00117933;
    }
    if (cVar1 == '1') goto LAB_00117933;
    if (cVar1 == 'n') {
      if (x[1] == 'o') {
        lStack_30 = 2;
        goto LAB_00117931;
      }
    }
    else if (cVar1 == 'o') {
      if (x[1] == 'n') {
        lStack_30 = 2;
        goto LAB_00117933;
      }
      if ((x[1] == 'f') && (x[2] == 'f')) {
        lStack_30 = 3;
        goto LAB_00117931;
      }
    }
    else if (cVar1 == '\0') goto LAB_001178bb;
LAB_001178fd:
    lStack_30 = 4;
    iVar2 = strncmp(x,"true",4);
    if (iVar2 == 0) goto LAB_00117933;
    lStack_30 = 5;
    iVar2 = strncmp(x,"false",5);
    if (iVar2 == 0) goto LAB_00117931;
  }
  iVar2 = 1;
LAB_0011793c:
  if (errPos != (char **)0x0) {
    *errPos = x;
  }
  return iVar2;
}

Assistant:

int xconvert(const char* x, bool& out, const char** errPos, int) {
	if      (empty(x, errPos))           { return 0; }
	else if (*x == '1')                  { out = true;  x += 1; }
	else if (*x == '0')                  { out = false; x += 1; }
	else if (strncmp(x, "no", 2)  == 0)  { out = false; x += 2; }
	else if (strncmp(x, "on", 2)  == 0)  { out = true;  x += 2; }
	else if (strncmp(x, "yes", 3) == 0)  { out = true;  x += 3; }
	else if (strncmp(x, "off", 3) == 0)  { out = false; x += 3; }
	else if (strncmp(x, "true", 4) == 0) { out = true;  x += 4; }
	else if (strncmp(x, "false", 5) == 0){ out = false; x += 5; }
	return parsed(1, x, errPos);
}